

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sender.cc
# Opt level: O0

void send_features(io_buf *b,example *ec,uint32_t mask)

{
  uchar *puVar1;
  uchar **ppuVar2;
  v_array<unsigned_char> *in_RSI;
  io_buf *in_RDI;
  namespace_index ns;
  uchar *__end1;
  uchar *__begin1;
  v_array<unsigned_char> *__range1;
  uint64_t in_stack_00000048;
  features *in_stack_00000050;
  uchar in_stack_0000005f;
  io_buf *in_stack_00000060;
  uchar in_stack_ffffffffffffffbf;
  io_buf *cache;
  uchar *local_28;
  
  cache = in_RDI;
  v_array<unsigned_char>::size(in_RSI);
  output_byte(cache,in_stack_ffffffffffffffbf);
  ppuVar2 = v_array<unsigned_char>::begin(in_RSI);
  local_28 = *ppuVar2;
  ppuVar2 = v_array<unsigned_char>::end(in_RSI);
  puVar1 = *ppuVar2;
  for (; local_28 != puVar1; local_28 = local_28 + 1) {
    if (*local_28 != 0x80) {
      output_features(in_stack_00000060,in_stack_0000005f,in_stack_00000050,in_stack_00000048);
    }
  }
  (*in_RDI->_vptr_io_buf[7])();
  return;
}

Assistant:

void send_features(io_buf* b, example& ec, uint32_t mask)
{
  // note: subtracting 1 b/c not sending constant
  output_byte(*b, (unsigned char)(ec.indices.size() - 1));

  for (namespace_index ns : ec.indices)
  {
    if (ns == constant_namespace)
      continue;
    output_features(*b, ns, ec.feature_space[ns], mask);
  }
  b->flush();
}